

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_mv_bit_cost(MV *mv,MV *ref_mv,int *mvjcost,int **mvcost,int weight)

{
  int iVar1;
  MV local_c;
  
  local_c.row = (*mv).row - (*ref_mv).row;
  local_c.col = (*mv).col - (*ref_mv).col;
  iVar1 = mv_cost(&local_c,mvjcost,mvcost);
  return iVar1 * weight + 0x40 >> 7;
}

Assistant:

int av1_mv_bit_cost(const MV *mv, const MV *ref_mv, const int *mvjcost,
                    int *const mvcost[2], int weight) {
  const MV diff = { mv->row - ref_mv->row, mv->col - ref_mv->col };
  return ROUND_POWER_OF_TWO(
      mv_cost(&diff, mvjcost, CONVERT_TO_CONST_MVCOST(mvcost)) * weight, 7);
}